

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  ZSTD_CCtx_params params_00;
  ZSTD_CCtx_params cctxParams_00;
  ZSTD_parameters params_01;
  size_t sVar1;
  undefined8 in_stack_ffffffffffffff30;
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params;
  int compressionLevel_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CCtx *cctx_local;
  
  ZSTD_getParams((ZSTD_parameters *)&cctxParams.customMem.opaque,compressionLevel,0xffffffffffffffff
                 ,dictSize);
  cctxParams_00.customMem.opaque = cctxParams.customMem.opaque;
  cctxParams_00._0_120_ = *(undefined1 (*) [120])&(cctx->requestedParams).cParams.chainLog;
  params_01.cParams._8_8_ = params.cParams._8_8_;
  params_01.cParams._0_8_ = params.cParams._0_8_;
  params_01.cParams._16_8_ = params.cParams._16_8_;
  params_01._24_8_ = params._24_8_;
  params_01.fParams.checksumFlag = (int)in_stack_ffffffffffffff30;
  params_01.fParams.noDictIDFlag = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  ZSTD_assignParamsToCCtxParams(cctxParams_00,params_01);
  params_00.cParams.chainLog = cctxParams.format;
  params_00.cParams.hashLog = cctxParams.cParams.windowLog;
  params_00.format = (int)in_stack_ffffffffffffff30;
  params_00.cParams.windowLog = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  params_00.cParams.searchLog = cctxParams.cParams.chainLog;
  params_00.cParams.minMatch = cctxParams.cParams.hashLog;
  params_00.cParams.targetLength = cctxParams.cParams.searchLog;
  params_00.cParams.strategy = cctxParams.cParams.minMatch;
  params_00.fParams.contentSizeFlag = cctxParams.cParams.targetLength;
  params_00.fParams.checksumFlag = cctxParams.cParams.strategy;
  params_00.fParams.noDictIDFlag = cctxParams.fParams.contentSizeFlag;
  params_00.compressionLevel = cctxParams.fParams.checksumFlag;
  params_00.forceWindow = cctxParams.fParams.noDictIDFlag;
  params_00.attachDictPref = cctxParams.compressionLevel;
  params_00.nbWorkers = cctxParams.forceWindow;
  params_00._60_4_ = cctxParams.attachDictPref;
  params_00.jobSize = cctxParams._56_8_;
  params_00.overlapLog = (undefined4)cctxParams.jobSize;
  params_00.rsyncable = cctxParams.jobSize._4_4_;
  params_00.ldmParams.enableLdm = cctxParams.overlapLog;
  params_00.ldmParams.hashLog = cctxParams.rsyncable;
  params_00.ldmParams.bucketSizeLog = cctxParams.ldmParams.enableLdm;
  params_00.ldmParams.minMatchLength = cctxParams.ldmParams.hashLog;
  params_00.ldmParams.hashRateLog = cctxParams.ldmParams.bucketSizeLog;
  params_00.ldmParams.windowLog = cctxParams.ldmParams.minMatchLength;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)cctxParams.ldmParams._16_8_;
  params_00.customMem.customFree = (ZSTD_freeFunction)cctxParams.customMem.customAlloc;
  params_00.customMem.opaque = cctxParams.customMem.customFree;
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,ZSTD_dct_auto,ZSTD_dtlm_fast,(ZSTD_CDict *)0x0,params_00,
                     0xffffffffffffffff,ZSTDb_not_buffered);
  return sVar1;
}

Assistant:

size_t ZSTD_compressBegin_usingDict(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize);
    ZSTD_CCtx_params const cctxParams =
            ZSTD_assignParamsToCCtxParams(cctx->requestedParams, params);
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}